

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

IdentifierLookupResult *
anon_unknown.dwarf_11255e::LookupObjectByName(ExpressionContext *ctx,uint nameHash)

{
  Node *start;
  Node *pNVar1;
  Node *pNVar3;
  long *plVar4;
  ScopeData *pSVar5;
  IdentifierLookupResult *unaff_R14;
  bool bVar6;
  NodeIterator NVar7;
  Node *pNVar2;
  
  pSVar5 = (ScopeData *)&ctx->scope;
  do {
    pSVar5 = pSVar5->scope;
    if (pSVar5 == (ScopeData *)0x0) {
      return (IdentifierLookupResult *)0x0;
    }
    NVar7 = DirectChainedMap<IdentifierLookupResult>::first(&pSVar5->idLookupMap,nameHash);
    pNVar2 = NVar7.node;
    if (pNVar2 == (Node *)0x0) {
      bVar6 = true;
    }
    else {
      if ((ctx->lookupLocation != (SynBase *)0x0) && (pSVar5->unrestricted == false)) {
LAB_0020f4e7:
        plVar4 = *(long **)(NVar7.node + 8);
        do {
          pNVar2 = NVar7.node;
          pNVar1 = NVar7.start;
          if (((plVar4 == (long *)0x0) || (plVar4[1] != 0)) ||
             (*(char **)(*plVar4 + 0x20) <= (ctx->lookupLocation->pos).begin)) break;
          pNVar3 = *(Node **)(pNVar2 + 0x18);
          if (pNVar3 != pNVar1) {
            do {
              if (pNVar3 == (Node *)0x0) break;
              if (*(int *)pNVar3 == *(int *)pNVar2) goto LAB_0020f52a;
              pNVar3 = *(Node **)(pNVar3 + 0x18);
            } while (pNVar3 != pNVar1);
          }
          pNVar1 = (Node *)0x0;
          pNVar3 = (Node *)0x0;
LAB_0020f52a:
          NVar7.node = pNVar3;
          NVar7.start = pNVar1;
          if (pNVar3 != (Node *)0x0) goto LAB_0020f4e7;
          plVar4 = (long *)0x0;
        } while( true );
      }
      bVar6 = pNVar2 == (Node *)0x0;
      if (!bVar6) {
        unaff_R14 = (IdentifierLookupResult *)(pNVar2 + 8);
      }
    }
    if (!bVar6) {
      return unaff_R14;
    }
  } while( true );
}

Assistant:

IdentifierLookupResult* LookupObjectByName(ExpressionContext &ctx, unsigned nameHash)
	{
		typedef DirectChainedMap<IdentifierLookupResult>::NodeIterator Node;

		ScopeData *scope = ctx.scope;

		while(scope)
		{
			if(Node lookup = scope->idLookupMap.first(nameHash))
			{
				if(ctx.lookupLocation && !scope->unrestricted)
				{
					VariableData *variable = lookup.node->value.variable;

					// Skip variables that are not visible from current point
					while(variable && !variable->importModule && variable->source->pos.begin > ctx.lookupLocation->pos.begin)
					{
						lookup = scope->idLookupMap.next(lookup);

						if(lookup.node)
							variable = lookup.node->value.variable;
						else
							variable = NULL;
					}
				}

				if(lookup.node)
					return &lookup.node->value;;
			}

			scope = scope->scope;
		}

		return NULL;
	}